

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void __thiscall
tcu::x11::glx::GlxWindow::GlxWindow(GlxWindow *this,GlxVisual *visual,RenderConfig *cfg)

{
  GlxDisplay *display;
  GLXWindow GVar1;
  
  (this->super_GlxDrawable)._vptr_GlxDrawable = (_func_int **)&PTR__GlxWindow_00769930;
  display = visual->m_display;
  this->m_x11Display = &display->super_XlibDisplay;
  XlibWindow::XlibWindow
            (&this->m_x11Window,&display->super_XlibDisplay,cfg->width,cfg->height,visual->m_visual)
  ;
  GVar1 = GlxVisual::createWindow(visual,(this->m_x11Window).m_window);
  this->m_GLXDrawable = GVar1;
  XlibWindow::setVisibility(&this->m_x11Window,cfg->windowVisibility != VISIBILITY_HIDDEN);
  return;
}

Assistant:

GlxWindow::GlxWindow (GlxVisual& visual, const RenderConfig& cfg)
	: m_x11Display	(visual.getGlxDisplay())
	, m_x11Window	(m_x11Display, cfg.width, cfg.height,
					 visual.getXVisual())
	, m_GLXDrawable	(visual.createWindow(m_x11Window.getXID()))
{
	m_x11Window.setVisibility(cfg.windowVisibility != RenderConfig::VISIBILITY_HIDDEN);
}